

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfgconv.cpp
# Opt level: O0

void usage(char *progname)

{
  ostream *poVar1;
  char *progname_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,progname);
  poVar1 = std::operator<<(poVar1," <Options> [CFG file]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Options:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"   -t   type        Input type");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "                        bftrace: bftrace input format");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "                        cfggrind: cfggrind input format");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "                        dcfg: pinplay dcfg input format");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"   -s   show        Strategy to show CFGs");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "                        all: show all CFGs [default]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "                        valid: show only valid CFGs");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "                        invalid: show only invalid CFGs");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "   -r   Range       Consider only CFGs in the range (start:end)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "                        can be used multiple times");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "   -a   Addr        Consider only CFGs with given address");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "                        can be used multiple times");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "   -A   File        Load file with addresses, one address per line");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "                        can be used multiple times");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "   -i   File        Instructions map (address:size:assembly per entry) file"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"   -d   Directory   Dump DOT cfgs in directory");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void usage(char* progname) {
	std::cout << "Usage: " << progname << " <Options> [CFG file]" << std::endl;
	std::cout << "Options:" << std::endl;
	std::cout << "   -t   type        Input type" << std::endl;
	std::cout << "                        bftrace: bftrace input format" << std::endl;
	std::cout << "                        cfggrind: cfggrind input format" << std::endl;
	std::cout << "                        dcfg: pinplay dcfg input format" << std::endl;
	std::cout << "   -s   show        Strategy to show CFGs" << std::endl;
	std::cout << "                        all: show all CFGs [default]" << std::endl;
	std::cout << "                        valid: show only valid CFGs" << std::endl;
	std::cout << "                        invalid: show only invalid CFGs" << std::endl;
	std::cout << "   -r   Range       Consider only CFGs in the range (start:end)" << std::endl;
	std::cout << "                        can be used multiple times" << std::endl;
	std::cout << "   -a   Addr        Consider only CFGs with given address" << std::endl;
	std::cout << "                        can be used multiple times" << std::endl;
	std::cout << "   -A   File        Load file with addresses, one address per line" << std::endl;
	std::cout << "                        can be used multiple times" << std::endl;
	std::cout << "   -i   File        Instructions map (address:size:assembly per entry) file" << std::endl;
	std::cout << "   -d   Directory   Dump DOT cfgs in directory" << std::endl;
	std::cout << std::endl;

	exit(1);
}